

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O1

RealType __thiscall OpenMD::Torsion::getValue(Torsion *this,int snapshotNo)

{
  undefined4 *puVar1;
  double *pdVar2;
  Atom *pAVar3;
  SnapshotManager *pSVar4;
  uint i;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar7;
  undefined4 uVar8;
  double tmp;
  undefined4 uVar9;
  double dVar10;
  double tmp_1;
  double dVar11;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector3<double> result_4;
  double local_138 [4];
  Vector3d local_118;
  Vector3d local_f8;
  double local_d8 [4];
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  Vector3d local_78;
  double local_58 [4];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  pAVar3 = *(this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar5 = (*((pAVar3->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar7 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar6 = *(long *)(CONCAT44(extraout_var,iVar5) + (pAVar3->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar6 + lVar7 * 0x18);
  local_38._0_4_ = *puVar1;
  local_38._4_4_ = puVar1[1];
  uStack_30 = puVar1[2];
  uStack_2c = puVar1[3];
  local_28 = *(undefined8 *)(lVar6 + 0x10 + lVar7 * 0x18);
  pAVar3 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  pSVar4 = (pAVar3->super_StuntDouble).snapshotMan_;
  iVar5 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  lVar7 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar6 = *(long *)(CONCAT44(extraout_var_00,iVar5) + (pAVar3->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar6 + lVar7 * 0x18);
  local_98._0_4_ = *puVar1;
  local_98._4_4_ = puVar1[1];
  uStack_90 = puVar1[2];
  uStack_8c = puVar1[3];
  local_88 = *(undefined8 *)(lVar6 + 0x10 + lVar7 * 0x18);
  pAVar3 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  pSVar4 = (pAVar3->super_StuntDouble).snapshotMan_;
  iVar5 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  lVar7 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar6 = *(long *)(CONCAT44(extraout_var_01,iVar5) + (pAVar3->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar6 + lVar7 * 0x18);
  local_b8._0_4_ = *puVar1;
  local_b8._4_4_ = puVar1[1];
  uStack_b0 = puVar1[2];
  uStack_ac = puVar1[3];
  local_a8 = *(undefined8 *)(lVar6 + 0x10 + lVar7 * 0x18);
  pAVar3 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[3];
  pSVar4 = (pAVar3->super_StuntDouble).snapshotMan_;
  iVar5 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  lVar7 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar6 = *(long *)(CONCAT44(extraout_var_02,iVar5) + (pAVar3->super_StuntDouble).storage_);
  pdVar2 = (double *)(lVar6 + lVar7 * 0x18);
  local_58[0] = *pdVar2;
  local_58[1] = pdVar2[1];
  local_58[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar7 * 0x18);
  local_118.super_Vector<double,_3U>.data_[0] = 0.0;
  local_118.super_Vector<double,_3U>.data_[1] = 0.0;
  local_118.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar6 = 0;
  do {
    local_118.super_Vector<double,_3U>.data_[lVar6] =
         (double)(&local_38)[lVar6] - (double)(&local_98)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_78.super_Vector<double,_3U>.data_[2] = local_118.super_Vector<double,_3U>.data_[2];
  local_78.super_Vector<double,_3U>.data_[0]._0_4_ =
       local_118.super_Vector<double,_3U>.data_[0]._0_4_;
  local_78.super_Vector<double,_3U>.data_[0]._4_4_ =
       local_118.super_Vector<double,_3U>.data_[0]._4_4_;
  local_78.super_Vector<double,_3U>.data_[1]._0_4_ =
       local_118.super_Vector<double,_3U>.data_[1]._0_4_;
  local_78.super_Vector<double,_3U>.data_[1]._4_4_ =
       local_118.super_Vector<double,_3U>.data_[1]._4_4_;
  pSVar4 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar5 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_03,iVar5),&local_78);
  local_f8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_f8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_f8.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar6 = 0;
  do {
    local_f8.super_Vector<double,_3U>.data_[lVar6] =
         (double)(&local_98)[lVar6] - (double)(&local_b8)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_118.super_Vector<double,_3U>.data_[2] = local_f8.super_Vector<double,_3U>.data_[2];
  local_118.super_Vector<double,_3U>.data_[0] = local_f8.super_Vector<double,_3U>.data_[0];
  local_118.super_Vector<double,_3U>.data_[1] = local_f8.super_Vector<double,_3U>.data_[1];
  pSVar4 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar5 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_04,iVar5),&local_118);
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar6 = 0;
  do {
    local_138[lVar6] = (double)(&local_b8)[lVar6] - local_58[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_f8.super_Vector<double,_3U>.data_[2] = local_138[2];
  local_f8.super_Vector<double,_3U>.data_[0] = local_138[0];
  local_f8.super_Vector<double,_3U>.data_[1] = local_138[1];
  pSVar4 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar5 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_05,iVar5),&local_f8);
  local_138[0] = local_118.super_Vector<double,_3U>.data_[2] *
                 (double)CONCAT44(local_78.super_Vector<double,_3U>.data_[1]._4_4_,
                                  local_78.super_Vector<double,_3U>.data_[1]._0_4_) -
                 local_78.super_Vector<double,_3U>.data_[2] *
                 local_118.super_Vector<double,_3U>.data_[1];
  local_138[1] = local_118.super_Vector<double,_3U>.data_[0] *
                 local_78.super_Vector<double,_3U>.data_[2] -
                 (double)CONCAT44(local_78.super_Vector<double,_3U>.data_[0]._4_4_,
                                  local_78.super_Vector<double,_3U>.data_[0]._0_4_) *
                 local_118.super_Vector<double,_3U>.data_[2];
  local_138[2] = (double)CONCAT44(local_78.super_Vector<double,_3U>.data_[0]._4_4_,
                                  local_78.super_Vector<double,_3U>.data_[0]._0_4_) *
                 local_118.super_Vector<double,_3U>.data_[1] -
                 local_118.super_Vector<double,_3U>.data_[0] *
                 (double)CONCAT44(local_78.super_Vector<double,_3U>.data_[1]._4_4_,
                                  local_78.super_Vector<double,_3U>.data_[1]._0_4_);
  dVar10 = 0.0;
  lVar6 = 0;
  do {
    dVar10 = dVar10 + local_138[lVar6] * local_138[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar11 = 0.0;
  local_d8[0] = local_f8.super_Vector<double,_3U>.data_[2] *
                local_118.super_Vector<double,_3U>.data_[1] -
                local_118.super_Vector<double,_3U>.data_[2] *
                local_f8.super_Vector<double,_3U>.data_[1];
  local_d8[1] = local_f8.super_Vector<double,_3U>.data_[0] *
                local_118.super_Vector<double,_3U>.data_[2] -
                local_118.super_Vector<double,_3U>.data_[0] *
                local_f8.super_Vector<double,_3U>.data_[2];
  local_d8[2] = local_118.super_Vector<double,_3U>.data_[0] *
                local_f8.super_Vector<double,_3U>.data_[1] -
                local_f8.super_Vector<double,_3U>.data_[0] *
                local_118.super_Vector<double,_3U>.data_[1];
  lVar6 = 0;
  do {
    dVar11 = dVar11 + local_d8[lVar6] * local_d8[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (dVar11 < 0.0) {
    local_d8[3] = dVar10;
    dVar11 = sqrt(dVar11);
    dVar10 = local_d8[3];
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  if (1e-06 <= dVar10 * dVar11) {
    dVar10 = 0.0;
    lVar6 = 0;
    do {
      dVar10 = dVar10 + local_138[lVar6] * local_138[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    lVar6 = 0;
    do {
      local_138[lVar6] = local_138[lVar6] / dVar10;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    dVar10 = 0.0;
    lVar6 = 0;
    do {
      dVar10 = dVar10 + local_d8[lVar6] * local_d8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    lVar6 = 0;
    do {
      local_d8[lVar6] = local_d8[lVar6] / dVar10;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    dVar10 = 0.0;
    lVar6 = 0;
    do {
      dVar10 = dVar10 + local_138[lVar6] * local_d8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    dVar11 = 1.0;
    if (dVar10 <= 1.0) {
      dVar11 = dVar10;
    }
    uVar8 = 0;
    uVar9 = 0xbff00000;
    if (-1.0 <= dVar11) {
      uVar8 = SUB84(dVar11,0);
      uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    dVar10 = acos((double)CONCAT44(uVar9,uVar8));
    uVar8 = SUB84(dVar10,0);
    uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
  }
  else {
    uVar8 = 0;
    uVar9 = 0x7ff80000;
  }
  return (RealType)CONCAT44(uVar9,uVar8);
}

Assistant:

RealType getValue(int snapshotNo) {
      Vector3d pos1 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[2]->getPos(snapshotNo);
      Vector3d pos4 = atoms_[3]->getPos(snapshotNo);

      Vector3d r21 = pos1 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r21);
      Vector3d r32 = pos2 - pos3;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r32);
      Vector3d r43 = pos3 - pos4;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r43);

      //  Calculate the cross products and distances
      Vector3d A  = cross(r21, r32);
      RealType rA = A.length();
      Vector3d B  = cross(r32, r43);
      RealType rB = B.length();

      /*
         If either of the two cross product vectors is tiny, that means
         the three atoms involved are colinear, and the torsion angle is
         going to be undefined.  The easiest check for this problem is
         to use the product of the two lengths.
      */
      if (rA * rB < OpenMD::epsilon) return numeric_limits<double>::quiet_NaN();

      A.normalize();
      B.normalize();

      //  Calculate the sin and cos
      RealType cos_phi = dot(A, B);
      if (cos_phi > 1.0) cos_phi = 1.0;
      if (cos_phi < -1.0) cos_phi = -1.0;
      return acos(cos_phi);
    }